

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

UnitsPtr __thiscall libcellml::Model::units(Model *this,string *name)

{
  bool bVar1;
  ModelImpl *pMVar2;
  reference psVar3;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  UnitsPtr UVar5;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_48 [3];
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_30;
  const_iterator result;
  string *name_local;
  Model *this_local;
  UnitsPtr *units;
  
  result._M_current._7_1_ = 0;
  std::shared_ptr<libcellml::Units>::shared_ptr((shared_ptr<libcellml::Units> *)this,(nullptr_t)0x0)
  ;
  pMVar2 = pFunc((Model *)name);
  local_30._M_current = (shared_ptr<libcellml::Units> *)ModelImpl::findUnits(pMVar2,in_RDX);
  pMVar2 = pFunc((Model *)name);
  local_48[0]._M_current =
       (shared_ptr<libcellml::Units> *)
       std::
       vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ::end(&pMVar2->mUnits);
  bVar1 = __gnu_cxx::operator!=(&local_30,local_48);
  _Var4._M_pi = extraout_RDX;
  if (bVar1) {
    psVar3 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
             ::operator*(&local_30);
    std::shared_ptr<libcellml::Units>::operator=((shared_ptr<libcellml::Units> *)this,psVar3);
    _Var4._M_pi = extraout_RDX_00;
  }
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (UnitsPtr)UVar5.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UnitsPtr Model::units(const std::string &name) const
{
    UnitsPtr units = nullptr;
    auto result = pFunc()->findUnits(name);
    if (result != pFunc()->mUnits.end()) {
        units = *result;
    }

    return units;
}